

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O3

void __thiscall
embree::sse2::BVHNMeshBuilderMorton<4,_embree::TriangleMesh,_embree::TriangleMv<4>_>::build
          (BVHNMeshBuilderMorton<4,_embree::TriangleMesh,_embree::TriangleMv<4>_> *this)

{
  mvector<BVHBuilderMorton::BuildPrim> *morton;
  bool bVar1;
  pointer ppTVar2;
  Device *pDVar3;
  Block *pBVar4;
  PrimRef *ptr;
  MemoryMonitorInterface *pMVar5;
  BuildPrim *pBVar6;
  __int_type_conflict _Var7;
  uint uVar8;
  long lVar9;
  BuildPrim *pBVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  __pointer_type pBVar15;
  BVH *pBVar16;
  pointer ppTVar17;
  ulong numPrimitives;
  EVP_PKEY_CTX *ctx;
  BVHNodeRecord<embree::NodeRefPtr<4>_> root;
  undefined1 local_111;
  size_t *local_110;
  CalculateMeshBounds<embree::TriangleMesh> local_108;
  BVH *local_100;
  FastAllocator *local_f8;
  BuildProgressMonitorInterface local_f0;
  CreateMortonLeaf<4,_embree::TriangleMv<4>_> local_e0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c8;
  size_t local_b8;
  size_t sStack_b0;
  size_t local_a8;
  FastAllocator **ppFStack_a0;
  undefined1 *local_98;
  BVH **ppBStack_90;
  CreateMortonLeaf<4,_embree::TriangleMv<4>_> *local_88;
  CalculateMeshBounds<embree::TriangleMesh> *local_80;
  BuildProgressMonitorInterface *local_78;
  undefined8 local_70;
  BVHNodeRecord<embree::NodeRefPtr<4>_> local_68;
  
  uVar8 = (this->mesh->super_Geometry).numPrimitives;
  if (uVar8 != this->numPreviousPrimitives) {
    pBVar16 = this->bvh;
    FastAllocator::internal_fix_used_blocks(&pBVar16->alloc);
    ppTVar17 = (pBVar16->alloc).thread_local_allocators.
               super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppTVar2 = (pBVar16->alloc).thread_local_allocators.
              super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppTVar17 != ppTVar2) {
      do {
        FastAllocator::ThreadLocal2::unbind(*ppTVar17,&pBVar16->alloc);
        ppTVar17 = ppTVar17 + 1;
      } while (ppTVar17 != ppTVar2);
      ppTVar17 = (pBVar16->alloc).thread_local_allocators.
                 super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((pBVar16->alloc).thread_local_allocators.
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppTVar17) {
        (pBVar16->alloc).thread_local_allocators.
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppTVar17;
      }
    }
    LOCK();
    (pBVar16->alloc).bytesUsed.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (pBVar16->alloc).bytesFree.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (pBVar16->alloc).bytesWasted.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    if ((pBVar16->alloc).usedBlocks._M_b._M_p != (__pointer_type)0x0) {
      pDVar3 = (pBVar16->alloc).device;
      bVar1 = (pBVar16->alloc).useUSM;
      pBVar15 = (pBVar16->alloc).usedBlocks._M_b._M_p;
      do {
        pBVar4 = pBVar15->next;
        FastAllocator::Block::clear_block(pBVar15,pDVar3,bVar1);
        pBVar15 = pBVar4;
      } while (pBVar4 != (Block *)0x0);
    }
    LOCK();
    (pBVar16->alloc).usedBlocks._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if ((pBVar16->alloc).freeBlocks._M_b._M_p != (__pointer_type)0x0) {
      pDVar3 = (pBVar16->alloc).device;
      bVar1 = (pBVar16->alloc).useUSM;
      pBVar15 = (pBVar16->alloc).freeBlocks._M_b._M_p;
      do {
        pBVar4 = pBVar15->next;
        FastAllocator::Block::clear_block(pBVar15,pDVar3,bVar1);
        pBVar15 = pBVar4;
      } while (pBVar4 != (Block *)0x0);
    }
    LOCK();
    (pBVar16->alloc).freeBlocks._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    lVar9 = -8;
    do {
      LOCK();
      (pBVar16->alloc).threadBlocks[lVar9]._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      LOCK();
      (pBVar16->alloc).threadBlocks[lVar9 + 8]._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0);
    sVar12 = (pBVar16->alloc).primrefarray.size_alloced;
    ptr = (pBVar16->alloc).primrefarray.items;
    if (ptr != (PrimRef *)0x0) {
      if (sVar12 << 5 < 0x1c00000) {
        alignedFree(ptr);
      }
      else {
        os_free(ptr,sVar12 << 5,(pBVar16->alloc).primrefarray.alloc.hugepages);
      }
    }
    if (sVar12 != 0) {
      pMVar5 = (pBVar16->alloc).primrefarray.alloc.device;
      (**pMVar5->_vptr_MemoryMonitorInterface)(pMVar5,sVar12 * -0x20,1);
    }
    (pBVar16->alloc).primrefarray.size_active = 0;
    (pBVar16->alloc).primrefarray.size_alloced = 0;
    (pBVar16->alloc).primrefarray.items = (PrimRef *)0x0;
    sVar12 = (this->morton).size_alloced;
    pBVar6 = (this->morton).items;
    if (pBVar6 != (BuildPrim *)0x0) {
      if (sVar12 * 8 < 0x1c00000) {
        alignedFree(pBVar6);
      }
      else {
        os_free(pBVar6,sVar12 * 8,(this->morton).alloc.hugepages);
      }
    }
    if (sVar12 != 0) {
      pMVar5 = (this->morton).alloc.device;
      (**pMVar5->_vptr_MemoryMonitorInterface)(pMVar5,sVar12 * -8,1);
    }
    (this->morton).size_active = 0;
    (this->morton).size_alloced = 0;
    (this->morton).items = (BuildPrim *)0x0;
    uVar8 = (this->mesh->super_Geometry).numPrimitives;
  }
  this->numPreviousPrimitives = uVar8;
  if (uVar8 == 0) {
    local_c8._0_8_ = 0x7f8000007f800000;
    local_c8._8_8_ = 0x7f8000007f800000;
    local_b8 = 0xff800000ff800000;
    sStack_b0 = 0xff800000ff800000;
    local_a8 = 0x7f8000007f800000;
    ppFStack_a0 = (FastAllocator **)0x7f8000007f800000;
    local_98 = (undefined1 *)0xff800000ff800000;
    ppBStack_90 = (BVH **)0xff800000ff800000;
    BVHN<4>::set(this->bvh,(NodeRef)0x8,(LBBox3fa *)&local_c8.field_1,0);
    return;
  }
  numPrimitives = (ulong)uVar8;
  uVar11 = (this->morton).size_alloced;
  uVar14 = uVar11;
  if ((uVar11 < numPrimitives) && (uVar14 = numPrimitives, uVar13 = uVar11, uVar11 != 0)) {
    do {
      uVar14 = uVar13 * 2 + (ulong)(uVar13 * 2 == 0);
      uVar13 = uVar14;
    } while (uVar14 < numPrimitives);
  }
  local_110 = &(this->morton).size_active;
  if (numPrimitives < (this->morton).size_active) {
    *local_110 = numPrimitives;
  }
  morton = &this->morton;
  if (uVar11 == uVar14) {
    *local_110 = numPrimitives;
    goto LAB_00bdf778;
  }
  pBVar6 = (this->morton).items;
  if (uVar14 == 0) {
    uVar11 = 0;
LAB_00bdf6ef:
    pBVar10 = (BuildPrim *)alignedMalloc(uVar11,8);
  }
  else {
    pMVar5 = (morton->alloc).device;
    uVar11 = uVar14 * 8;
    (**pMVar5->_vptr_MemoryMonitorInterface)(pMVar5,uVar11,0);
    if (uVar11 < 0x1c00000) goto LAB_00bdf6ef;
    pBVar10 = (BuildPrim *)os_malloc(uVar11,&(this->morton).alloc.hugepages);
  }
  (this->morton).items = pBVar10;
  if ((this->morton).size_active == 0) {
    sVar12 = (this->morton).size_alloced;
    if (pBVar6 != (BuildPrim *)0x0) goto LAB_00bdf72d;
  }
  else {
    uVar11 = 0;
    do {
      (this->morton).items[uVar11].field_0 = pBVar6[uVar11].field_0;
      uVar11 = uVar11 + 1;
    } while (uVar11 < (this->morton).size_active);
    sVar12 = (this->morton).size_alloced;
LAB_00bdf72d:
    if (sVar12 * 8 < 0x1c00000) {
      alignedFree(pBVar6);
    }
    else {
      os_free(pBVar6,sVar12 * 8,(this->morton).alloc.hugepages);
    }
  }
  if (sVar12 != 0) {
    pMVar5 = (morton->alloc).device;
    (**pMVar5->_vptr_MemoryMonitorInterface)(pMVar5,sVar12 * -8,1);
  }
  (this->morton).size_active = numPrimitives;
  (this->morton).size_alloced = uVar14;
LAB_00bdf778:
  FastAllocator::init(&this->bvh->alloc,(EVP_PKEY_CTX *)(numPrimitives * 8));
  pBVar15 = (this->bvh->alloc).freeBlocks._M_b._M_p;
  _Var7 = (pBVar15->cur).super___atomic_base<unsigned_long>._M_i;
  sVar12 = createMortonCodeArray<embree::TriangleMesh>
                     (this->mesh,morton,
                      &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
  local_100 = this->bvh;
  local_108.mesh = this->mesh;
  local_e0.geomID_ = this->geomID_;
  local_e0.morton = (this->morton).items;
  local_f8 = &local_100->alloc;
  local_78 = &local_f0;
  local_f0.super_BuildProgressMonitor._vptr_BuildProgressMonitor =
       (_func_int **)&PTR_operator___02185a30;
  local_f0.scene = (local_100->scene->progressInterface).scene;
  local_88 = &local_e0;
  ppFStack_a0 = &local_f8;
  ppBStack_90 = &local_100;
  local_80 = &local_108;
  local_a8 = (this->settings).singleThreadThreshold;
  local_c8._0_8_ = (this->settings).branchingFactor;
  local_c8._8_8_ = (this->settings).maxDepth;
  local_b8 = (this->settings).minLeafSize;
  sStack_b0 = (this->settings).maxLeafSize;
  local_98 = &local_111;
  local_70 = 0;
  local_e0.mesh = local_108.mesh;
  BVHBuilderMorton::
  BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleMv<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
  ::build(&local_68,
          (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleMv<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
           *)&local_c8.field_1,local_e0.morton,(BuildPrim *)(pBVar15->data + _Var7),sVar12);
  local_c8._0_8_ = local_68.bounds.lower.field_0._0_8_;
  local_c8._8_8_ = local_68.bounds.lower.field_0._8_8_;
  local_b8 = local_68.bounds.upper.field_0._0_8_;
  sStack_b0 = local_68.bounds.upper.field_0._8_8_;
  local_a8 = local_68.bounds.lower.field_0._0_8_;
  ppFStack_a0 = (FastAllocator **)local_68.bounds.lower.field_0._8_8_;
  local_98 = (undefined1 *)local_68.bounds.upper.field_0._0_8_;
  ppBStack_90 = (BVH **)local_68.bounds.upper.field_0._8_8_;
  BVHN<4>::set(this->bvh,(NodeRef)local_68.ref.ptr,(LBBox3fa *)&local_c8.field_1,numPrimitives);
  BVHNRotate<4>::rotate((NodeRef)(this->bvh->root).ptr,1);
  ctx = (EVP_PKEY_CTX *)&this->bvh->root;
  BVHN<4>::clearBarrier(this->bvh,(NodeRef *)ctx);
  pBVar16 = this->bvh;
  if ((pBVar16->scene->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE) {
    sVar12 = (this->morton).size_alloced;
    pBVar6 = (this->morton).items;
    if (pBVar6 != (BuildPrim *)0x0) {
      ctx = (EVP_PKEY_CTX *)(sVar12 * 8);
      if (ctx < (EVP_PKEY_CTX *)0x1c00000) {
        alignedFree(pBVar6);
      }
      else {
        os_free(pBVar6,(size_t)ctx,(this->morton).alloc.hugepages);
      }
    }
    if (sVar12 != 0) {
      pMVar5 = (morton->alloc).device;
      ctx = (EVP_PKEY_CTX *)(sVar12 * -8);
      (**pMVar5->_vptr_MemoryMonitorInterface)(pMVar5,ctx,1);
    }
    *local_110 = 0;
    local_110[1] = 0;
    local_110[2] = 0;
    pBVar16 = this->bvh;
  }
  BVHN<4>::cleanup(pBVar16,ctx);
  return;
}

Assistant:

void build() 
      {
        /* we reset the allocator when the mesh size changed */
        if (mesh->numPrimitives != numPreviousPrimitives) {
          bvh->alloc.clear();
          morton.clear();
        }
        size_t numPrimitives = mesh->size();
        numPreviousPrimitives = numPrimitives;
        
        /* skip build for empty scene */
        if (numPrimitives == 0) {
          bvh->set(BVH::emptyNode,empty,0);
          return;
        }
        
        /* preallocate arrays */
        morton.resize(numPrimitives);
        size_t bytesEstimated = numPrimitives*sizeof(AABBNode)/(4*N) + size_t(1.2f*Primitive::blocks(numPrimitives)*sizeof(Primitive));
        size_t bytesMortonCodes = numPrimitives*sizeof(BVHBuilderMorton::BuildPrim);
        bytesEstimated = max(bytesEstimated,bytesMortonCodes); // the first allocation block is reused to sort the morton codes
        bvh->alloc.init(bytesMortonCodes,bytesMortonCodes,bytesEstimated);

        /* create morton code array */
        BVHBuilderMorton::BuildPrim* dest = (BVHBuilderMorton::BuildPrim*) bvh->alloc.specialAlloc(bytesMortonCodes);
        size_t numPrimitivesGen = createMortonCodeArray<Mesh>(mesh,morton,bvh->scene->progressInterface);

        /* create BVH */
        SetBVHNBounds<N> setBounds(bvh);
        CreateMortonLeaf<N,Primitive> createLeaf(mesh,geomID_,morton.data());
        CalculateMeshBounds<Mesh> calculateBounds(mesh);
        auto root = BVHBuilderMorton::build<NodeRecord>(
          typename BVH::CreateAlloc(bvh), 
          typename BVH::AABBNode::Create(),
          setBounds,createLeaf,calculateBounds,bvh->scene->progressInterface,
          morton.data(),dest,numPrimitivesGen,settings);
        
        bvh->set(root.ref,LBBox3fa(root.bounds),numPrimitives);
        
#if ROTATE_TREE
        if (N == 4)
        {
          for (int i=0; i<ROTATE_TREE; i++)
            BVHNRotate<N>::rotate(bvh->root);
          bvh->clearBarrier(bvh->root);
        }
#endif

        /* clear temporary data for static geometry */
        if (bvh->scene->isStaticAccel()) {
          morton.clear();
        }
        bvh->cleanup();
      }